

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrCore.cpp
# Opt level: O3

void __thiscall amrex::AmrCore::regrid(AmrCore *this,int lbase,Real time,bool param_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  pointer pDVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer pBVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  undefined8 *puVar8;
  BoxArray *pBVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  undefined4 uVar16;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  BoxArray level_grids;
  uint local_e4;
  Real local_e0;
  DistributionMapping local_d8;
  long local_c8;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_c0;
  DistributionMapping local_a8;
  BoxArray local_98;
  
  bVar15 = 0;
  if (lbase < (this->super_AmrMesh).super_AmrInfo.max_level) {
    local_e0 = time;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&local_c0,(long)*(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c + 2,
               (allocator_type *)&local_98);
    AmrMesh::MakeNewGrids
              (&this->super_AmrMesh,lbase,local_e0,(int *)&local_e4,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_c0);
    uVar14 = (ulong)local_e4;
    if (lbase < (int)local_e4) {
      lVar12 = (long)lbase;
      uVar7 = lbase + 1;
      lVar11 = lVar12 * 0x10 + 0x18;
      bVar2 = false;
      lVar10 = lVar12 * 0x68;
      do {
        if (lVar12 < *(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c) {
          bVar5 = BoxArray::operator!=
                            ((BoxArray *)
                             ((long)&local_c0.
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                             lVar10),(BoxArray *)
                                     ((long)&(this->super_AmrMesh).grids.
                                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                             .
                                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].m_bat.
                                             m_bat_type + lVar10));
          if (bVar2 == false && !bVar5) {
            bVar2 = false;
          }
          else {
            BoxArray::BoxArray(&local_98,
                               (BoxArray *)
                               ((long)&(this->super_AmrMesh).grids.
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       .
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type
                               + lVar10));
            pBVar3 = local_c0.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pDVar1 = (this->super_AmrMesh).dmap.
                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     .
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_d8.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)((long)pDVar1 + lVar11 + -8);
            local_d8.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(pDVar1->m_ref).
                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + lVar11);
            uVar16 = SUB84(local_e0,0);
            if (local_d8.m_ref.
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_d8.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_d8.m_ref.
                      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_d8.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_d8.m_ref.
                      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (bVar5) {
              puVar8 = (undefined8 *)
                       ((long)&local_c0.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                       lVar10);
              pBVar9 = &local_98;
              for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
                *(undefined8 *)&pBVar9->m_bat = *puVar8;
                puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
                pBVar9 = (BoxArray *)((long)pBVar9 + (ulong)bVar15 * -0x10 + 8);
              }
              __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&local_c0.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].m_ref.
                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi + lVar10);
              local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)__r[-1]._M_pi;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_98.m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         __r);
              local_98.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)__r[1]._M_pi;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_98.m_simplified_list.
                          super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&pBVar3[1].m_simplified_list.
                                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + lVar10));
              DistributionMapping::DistributionMapping
                        (&local_a8,&local_98,*(int *)(ParallelContext::frames + 0x10));
              _Var4._M_pi = local_a8.m_ref.
                            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
              local_d8.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = local_a8.m_ref.
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              this_00._M_pi =
                   local_d8.m_ref.
                   super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              local_a8.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              local_a8.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_d8.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = _Var4._M_pi;
              if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
                 local_a8.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_a8.m_ref.
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              uVar16 = SUB84(local_e0,0);
            }
            uVar13 = (this->super_AmrMesh).num_setdm;
            local_c8 = lVar12;
            (*(this->super_AmrMesh)._vptr_AmrMesh[9])(uVar16,this,(ulong)uVar7,&local_98,&local_d8);
            AmrMesh::SetBoxArray(&this->super_AmrMesh,uVar7,&local_98);
            if (uVar13 == (this->super_AmrMesh).num_setdm) {
              AmrMesh::SetDistributionMap(&this->super_AmrMesh,uVar7,&local_d8);
            }
            lVar12 = local_c8;
            if (local_d8.m_ref.
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            BoxArray::~BoxArray(&local_98);
            bVar2 = bVar5;
          }
        }
        else {
          local_c8 = lVar12;
          DistributionMapping::DistributionMapping
                    ((DistributionMapping *)&local_98,
                     (BoxArray *)
                     ((long)&local_c0.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar10),
                     *(int *)(ParallelContext::frames + 0x10));
          uVar13 = (this->super_AmrMesh).num_setdm;
          (*(this->super_AmrMesh)._vptr_AmrMesh[8])
                    (SUB84(local_e0,0),this,(ulong)uVar7,
                     (long)&local_c0.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar10,
                     &local_98);
          AmrMesh::SetBoxArray
                    (&this->super_AmrMesh,uVar7,
                     (BoxArray *)
                     ((long)&local_c0.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar10))
          ;
          if (uVar13 == (this->super_AmrMesh).num_setdm) {
            AmrMesh::SetDistributionMap(&this->super_AmrMesh,uVar7,(DistributionMapping *)&local_98)
            ;
          }
          lVar12 = local_c8;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.m_bat.m_op._4_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.m_bat.m_op._4_8_);
          }
        }
        lVar12 = lVar12 + 1;
        uVar14 = (ulong)(int)local_e4;
        uVar7 = uVar7 + 1;
        lVar11 = lVar11 + 0x10;
        lVar10 = lVar10 + 0x68;
      } while (lVar12 < (long)uVar14);
    }
    uVar7 = (uint)uVar14;
    if ((int)(uint)uVar14 < *(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c) {
      do {
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
        (*(this->super_AmrMesh)._vptr_AmrMesh[10])(this,uVar14);
        AmrMesh::ClearBoxArray(&this->super_AmrMesh,uVar13);
        AmrMesh::ClearDistributionMap(&this->super_AmrMesh,uVar13);
        uVar7 = local_e4;
      } while ((int)uVar13 < *(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c);
    }
    *(uint *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c = uVar7;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_c0);
  }
  return;
}

Assistant:

void
AmrCore::regrid (int lbase, Real time, bool)
{
    if (lbase >= max_level) return;

    int new_finest;
    Vector<BoxArray> new_grids(finest_level+2);
    MakeNewGrids(lbase, time, new_finest, new_grids);

    BL_ASSERT(new_finest <= finest_level+1);

    bool coarse_ba_changed = false;
    for (int lev = lbase+1; lev <= new_finest; ++lev)
    {
        if (lev <= finest_level) // an old level
        {
            bool ba_changed = (new_grids[lev] != grids[lev]);
            if (ba_changed || coarse_ba_changed) {
                BoxArray level_grids = grids[lev];
                DistributionMapping level_dmap = dmap[lev];
                if (ba_changed) {
                    level_grids = new_grids[lev];
                    level_dmap = DistributionMapping(level_grids);
                }
                const auto old_num_setdm = num_setdm;
                RemakeLevel(lev, time, level_grids, level_dmap);
                SetBoxArray(lev, level_grids);
                if (old_num_setdm == num_setdm) {
                    SetDistributionMap(lev, level_dmap);
                }
            }
            coarse_ba_changed = ba_changed;;
        }
        else  // a new level
        {
            DistributionMapping new_dmap(new_grids[lev]);
            const auto old_num_setdm = num_setdm;
            MakeNewLevelFromCoarse(lev, time, new_grids[lev], new_dmap);
            SetBoxArray(lev, new_grids[lev]);
            if (old_num_setdm == num_setdm) {
                SetDistributionMap(lev, new_dmap);
            }
        }
    }

    for (int lev = new_finest+1; lev <= finest_level; ++lev) {
        ClearLevel(lev);
        ClearBoxArray(lev);
        ClearDistributionMap(lev);
    }

    finest_level = new_finest;
}